

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::dtime_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_t(*)(duckdb::dtime_t,duckdb::dtime_t)>
               (dtime_t *ldata,dtime_t *rdata,dtime_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,_func_dtime_t_dtime_t_dtime_t *fun)

{
  _func_dtime_t_dtime_t_dtime_t *fun_00;
  bool bVar1;
  dtime_t dVar2;
  idx_t iVar3;
  idx_t iVar4;
  SelectionVector *in_RCX;
  long in_RDX;
  idx_t in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  dtime_t rentry_1;
  dtime_t lentry_1;
  idx_t i_1;
  dtime_t rentry;
  dtime_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff48;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff50;
  long lVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff58;
  ValidityMask *in_stack_ffffffffffffff60;
  _func_dtime_t_dtime_t_dtime_t *in_stack_ffffffffffffff68;
  dtime_t in_stack_ffffffffffffff70;
  dtime_t in_stack_ffffffffffffff78;
  ulong local_78;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_78 = 0; local_78 < in_R9; local_78 = local_78 + 1) {
      lVar5 = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_78);
      fun_00 = *(_func_dtime_t_dtime_t_dtime_t **)(lVar5 + iVar3 * 8);
      iVar3 = in_RSI;
      iVar4 = SelectionVector::get_index(in_R8,local_78);
      dVar2.micros = *(int64_t *)(iVar3 + iVar4 * 8);
      in_stack_ffffffffffffff70 =
           BinaryLambdaWrapper::
           Operation<duckdb::dtime_t(*)(duckdb::dtime_t,duckdb::dtime_t),bool,duckdb::dtime_t,duckdb::dtime_t,duckdb::dtime_t>
                     (fun_00,dVar2,in_stack_ffffffffffffff70,dVar2,iVar3);
      *(int64_t *)(in_RDX + local_78 * 8) = in_stack_ffffffffffffff70.micros;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_RCX,local_38);
      SelectionVector::get_index(in_R8,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff58,(idx_t)in_stack_ffffffffffffff50);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff58,(idx_t)in_stack_ffffffffffffff50), bVar1)) {
        dVar2 = BinaryLambdaWrapper::
                Operation<duckdb::dtime_t(*)(duckdb::dtime_t,duckdb::dtime_t),bool,duckdb::dtime_t,duckdb::dtime_t,duckdb::dtime_t>
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,
                           (idx_t)in_stack_ffffffffffffff58);
        *(int64_t *)(in_RDX + local_38 * 8) = dVar2.micros;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}